

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Shop::printMedicine(Shop *this,int i)

{
  ostream *poVar1;
  Medicine medicine;
  Medicine local_b0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Company Name",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Unit Price",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Stock",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quantity",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Arrival Date",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expire Date",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  Medicine::Medicine(&local_b0,
                     (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_start + i);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_b0.name._M_dataplus._M_p,local_b0.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_b0.companyName._M_dataplus._M_p,
                      local_b0.companyName._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t    ",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_b0.unitePrice);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t   ",5);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t  ",4);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_b0.quantity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t  ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_b0.arrivalDate._M_dataplus._M_p,
                      local_b0.arrivalDate._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_b0.expireDate._M_dataplus._M_p,
                      local_b0.expireDate._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.expireDate._M_dataplus._M_p != &local_b0.expireDate.field_2) {
    operator_delete(local_b0.expireDate._M_dataplus._M_p,
                    local_b0.expireDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.arrivalDate._M_dataplus._M_p != &local_b0.arrivalDate.field_2) {
    operator_delete(local_b0.arrivalDate._M_dataplus._M_p,
                    local_b0.arrivalDate.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.companyName._M_dataplus._M_p != &local_b0.companyName.field_2) {
    operator_delete(local_b0.companyName._M_dataplus._M_p,
                    local_b0.companyName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
    operator_delete(local_b0.name._M_dataplus._M_p,local_b0.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void printMedicine(int i) {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        Medicine medicine = medicineList[i];
        cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
             << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
             << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
    }